

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove4<(moira::Instr)71,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  long lVar1;
  AEStackFrame frame;
  AEStackFrame frame_00;
  bool bVar2;
  uint n;
  int iVar3;
  u32 addr;
  int iVar4;
  ushort in_SI;
  Moira *in_RDI;
  AEStackFrame AVar5;
  int format;
  u64 flags2;
  u64 flags1;
  u64 flags0;
  int dst;
  int src;
  u32 data;
  u32 ea;
  u16 ird;
  u32 in_stack_ffffffffffffff78;
  u32 in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  u32 pc;
  u32 n_00;
  undefined4 in_stack_ffffffffffffff90;
  u32 in_stack_ffffffffffffff94;
  Moira *in_stack_ffffffffffffff98;
  undefined4 local_14;
  
  pc = (u32)in_RDI;
  n_00 = (u32)((ulong)in_RDI >> 0x20);
  getIRD(in_RDI);
  n = (int)(uint)in_SI >> 9 & 7;
  bVar2 = readOp<(moira::Mode)4,(moira::Size)2,64ul>
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,(u32 *)CONCAT44(n_00,pc),
                     (u32 *)CONCAT26(in_stack_ffffffffffffff86,
                                     CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)))
  ;
  if (bVar2) {
    iVar3 = 2;
    if ((*(byte *)(CONCAT44(n_00,pc) + 0x5c9e) & 1) != 0) {
      iVar3 = 1;
    }
    bVar2 = NBIT<(moira::Size)2>((ulong)local_14);
    *(bool *)(CONCAT44(n_00,pc) + 0x5c9b) = bVar2;
    bVar2 = ZERO<(moira::Size)2>((ulong)local_14);
    lVar1 = CONCAT44(n_00,pc);
    *(bool *)(lVar1 + 0x5c9c) = bVar2;
    *(undefined1 *)(lVar1 + 0x5c9d) = 0;
    *(undefined1 *)(lVar1 + 0x5c9e) = 0;
    prefetch<0ul>((Moira *)CONCAT26(in_stack_ffffffffffffff86,
                                    CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
    (**(code **)(*(long *)CONCAT44(n_00,pc) + 200))((long *)CONCAT44(n_00,pc),0xfffffffe);
    addr = computeEA<(moira::Mode)4,(moira::Size)2,0ul>
                     ((Moira *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),n_00);
    bVar2 = misaligned<(moira::Size)2>((Moira *)CONCAT44(n_00,pc),addr);
    iVar4 = CONCAT22(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84);
    if (bVar2) {
      if (iVar3 == 0) {
        in_stack_ffffffffffffff80 = addr + 2;
        iVar4 = *(int *)(CONCAT44(n_00,pc) + 0x5c90) + 2;
        getSR((Moira *)0x289b18);
        makeFrame<40ul>((Moira *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),n_00,
                        pc,(u16)((uint)iVar4 >> 0x10),(u16)iVar4);
        AVar5.addr = n_00;
        AVar5._0_4_ = pc;
        AVar5.ird = (short)in_stack_ffffffffffffff90;
        AVar5.sr = (short)((uint)in_stack_ffffffffffffff90 >> 0x10);
        AVar5.pc = in_stack_ffffffffffffff94;
        execAddressError((Moira *)CONCAT26((short)((uint)iVar4 >> 0x10),
                                           CONCAT24((short)iVar4,in_stack_ffffffffffffff80)),AVar5,
                         in_stack_ffffffffffffff7c);
      }
      if (iVar3 == 1) {
        makeFrame<1064ul>((Moira *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          n_00,pc);
        frame.addr = n_00;
        frame._0_4_ = pc;
        frame.ird = (short)in_stack_ffffffffffffff90;
        frame.sr = (short)((uint)in_stack_ffffffffffffff90 >> 0x10);
        frame.pc = in_stack_ffffffffffffff94;
        execAddressError((Moira *)CONCAT26((short)((uint)iVar4 >> 0x10),
                                           CONCAT24((short)iVar4,in_stack_ffffffffffffff80)),frame,
                         in_stack_ffffffffffffff7c);
      }
      if (iVar3 == 2) {
        AVar5 = makeFrame<40ul>((Moira *)CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),n_00,pc);
        frame_00.addr = n_00;
        frame_00._0_4_ = pc;
        frame_00.ird = (short)in_stack_ffffffffffffff90;
        frame_00.sr = (short)((uint)in_stack_ffffffffffffff90 >> 0x10);
        frame_00.pc = AVar5._0_4_;
        execAddressError((Moira *)CONCAT26((short)((uint)iVar4 >> 0x10),
                                           CONCAT24((short)iVar4,in_stack_ffffffffffffff80)),
                         frame_00,in_stack_ffffffffffffff7c);
      }
      updateAn<(moira::Mode)4,(moira::Size)2>((Moira *)CONCAT44(n_00,pc),n);
    }
    else {
      writeM<(moira::Mode)4,(moira::Size)2,5ul>
                ((Moira *)CONCAT26(in_stack_ffffffffffffff86,
                                   CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      updateAn<(moira::Mode)4,(moira::Size)2>((Moira *)CONCAT44(n_00,pc),n);
    }
  }
  return;
}

Assistant:

void
Moira::execMove4(u16 opcode)
{
    u16 ird = getIRD();
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is pre-decrement, steps 4 and 5
     *  above are inverted. So it behaves like a read modify instruction and it
     *  is a class 0 instruction. Note: The behavior is the same disregarding
     *  transfer size (byte, word or long), and disregarding the source
     *  addressing mode."
     */
    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;

    // Determine next address error stack frame format
    const u64 flags0 = AE_WRITE | AE_DATA;
    const u64 flags1 = AE_WRITE | AE_DATA | AE_SET_CB3;
    const u64 flags2 = AE_WRITE | AE_DATA;
    int format = (S == Long) ? 0 : reg.sr.c ? 1 : 2;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch();
    sync(-2);

    ea = computeEA<MODE_PD, S>(dst);
    
    // Check for address error
    if (misaligned<S>(ea)) {
        if (format == 0) execAddressError(makeFrame<flags0>(ea + 2, reg.pc + 2, getSR(), ird));
        if (format == 1) execAddressError(makeFrame<flags1>(ea, reg.pc + 2), 2);
        if (format == 2) execAddressError(makeFrame<flags2>(ea, reg.pc + 2), 2);
        if (S != Long) updateAn <MODE_PD, S> (dst);
        return;
    }
    
    writeM<MODE_PD, S, REVERSE | POLLIPL>(ea, data);
    updateAn<MODE_PD, S>(dst);
}